

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::MetaVariable::MetaVariable<std::__cxx11::string>(MetaVariable *this,ParseState *v)

{
  void *local_20;
  ParseState *local_18;
  ParseState *v_local;
  MetaVariable *this_local;
  
  local_20 = (void *)0x0;
  local_18 = v;
  v_local = (ParseState *)this;
  tinyusdz::value::Value::Value<decltype(nullptr)>(&this->_value,&local_20);
  ::std::__cxx11::string::string((string *)&this->_name);
  set_value<std::__cxx11::string>(this,local_18);
  return;
}

Assistant:

MetaVariable(const T &v) {
    set_value(v);
  }